

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void load_buffer_16xn_avx2
               (int16_t *input,__m256i *out,int stride,int height,int outstride,int flipud,
               int fliplr)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  long lVar7;
  int in_EDX;
  longlong in_RSI;
  longlong in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar8;
  undefined8 uVar9;
  __m128i x;
  __m128i x_00;
  int in_stack_00000008;
  int i_2;
  int i_1;
  int i;
  __m256i out1 [64];
  int local_910;
  int local_90c;
  int local_908;
  int local_904;
  undefined8 local_900 [258];
  int local_ec;
  int local_e8;
  int local_e4;
  longlong local_e0;
  long local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_ec = in_R8D;
  local_e8 = in_ECX;
  local_e4 = in_EDX;
  local_e0 = in_RSI;
  local_d8 = in_RDI;
  if (in_R9D == 0) {
    for (local_904 = 0; local_904 < local_e8; local_904 = local_904 + 1) {
      local_88 = (undefined8 *)(local_d8 + (long)(local_904 * local_e4) * 2);
      uVar8 = local_88[1];
      uVar9 = local_88[2];
      uVar2 = local_88[3];
      lVar7 = (long)local_904;
      local_900[lVar7 * 4] = *local_88;
      local_900[lVar7 * 4 + 1] = uVar8;
      local_900[lVar7 * 4 + 2] = uVar9;
      local_900[lVar7 * 4 + 3] = uVar2;
    }
  }
  else {
    for (local_908 = 0; local_908 < local_e8; local_908 = local_908 + 1) {
      local_90 = (undefined8 *)(local_d8 + (long)(local_908 * local_e4) * 2);
      uVar8 = local_90[1];
      uVar9 = local_90[2];
      uVar2 = local_90[3];
      lVar7 = (long)((local_e8 + -1) - local_908);
      local_900[lVar7 * 4] = *local_90;
      local_900[lVar7 * 4 + 1] = uVar8;
      local_900[lVar7 * 4 + 2] = uVar9;
      local_900[lVar7 * 4 + 3] = uVar2;
    }
  }
  if (in_stack_00000008 == 0) {
    for (local_90c = 0; local_90c < local_e8; local_90c = local_90c + 1) {
      lVar7 = (long)local_90c;
      local_60 = local_900[lVar7 * 4];
      uStack_58 = local_900[lVar7 * 4 + 1];
      uStack_50 = local_900[lVar7 * 4 + 2];
      uStack_48 = local_900[lVar7 * 4 + 3];
      local_a0 = local_60;
      uStack_98 = uStack_58;
      auVar6._8_8_ = uStack_58;
      auVar6._0_8_ = local_60;
      auVar1 = vpmovsxwd_avx2(auVar6);
      *(undefined1 (*) [32])(local_e0 + (long)(local_90c * local_ec) * 0x20) = auVar1;
      local_b0 = local_900[(long)local_90c * 4 + 2];
      uStack_a8 = local_900[(long)local_90c * 4 + 3];
      auVar5._8_8_ = local_900[(long)local_90c * 4 + 3];
      auVar5._0_8_ = local_900[(long)local_90c * 4 + 2];
      auVar1 = vpmovsxwd_avx2(auVar5);
      *(undefined1 (*) [32])(local_e0 + (long)(local_90c * local_ec + 1) * 0x20) = auVar1;
    }
  }
  else {
    for (local_910 = 0; local_910 < local_e8; local_910 = local_910 + 1) {
      lVar7 = (long)local_910;
      uVar8 = local_900[lVar7 * 4];
      uVar9 = local_900[lVar7 * 4 + 1];
      uStack_70 = local_900[lVar7 * 4 + 2];
      uStack_68 = local_900[lVar7 * 4 + 3];
      x[1] = in_RSI;
      x[0] = in_RDI;
      local_80 = uVar8;
      uStack_78 = uVar9;
      mm_reverse_epi16(x);
      local_c0 = uVar8;
      uStack_b8 = uVar9;
      auVar4._8_8_ = uVar9;
      auVar4._0_8_ = uVar8;
      auVar1 = vpmovsxwd_avx2(auVar4);
      *(undefined1 (*) [32])((long)(local_910 * local_ec) * 0x20 + 0x20 + local_e0) = auVar1;
      uVar8 = local_900[(long)local_910 * 4 + 2];
      uVar9 = local_900[(long)local_910 * 4 + 3];
      x_00[1] = in_RSI;
      x_00[0] = in_RDI;
      mm_reverse_epi16(x_00);
      local_d0 = uVar8;
      uStack_c8 = uVar9;
      auVar3._8_8_ = uVar9;
      auVar3._0_8_ = uVar8;
      auVar1 = vpmovsxwd_avx2(auVar3);
      *(undefined1 (*) [32])(local_e0 + (long)(local_910 * local_ec) * 0x20) = auVar1;
    }
  }
  return;
}

Assistant:

static inline void load_buffer_16xn_avx2(const int16_t *input, __m256i *out,
                                         int stride, int height, int outstride,
                                         int flipud, int fliplr) {
  __m256i out1[64];
  if (!flipud) {
    for (int i = 0; i < height; i++) {
      out1[i] = _mm256_loadu_si256((const __m256i *)(input + i * stride));
    }
  } else {
    for (int i = 0; i < height; i++) {
      out1[(height - 1) - i] =
          _mm256_loadu_si256((const __m256i *)(input + i * stride));
    }
  }
  if (!fliplr) {
    for (int i = 0; i < height; i++) {
      out[i * outstride] =
          _mm256_cvtepi16_epi32(_mm256_castsi256_si128(out1[i]));
      out[i * outstride + 1] =
          _mm256_cvtepi16_epi32(_mm256_extractf128_si256(out1[i], 1));
    }
  } else {
    for (int i = 0; i < height; i++) {
      out[i * outstride + 1] = _mm256_cvtepi16_epi32(
          mm_reverse_epi16(_mm256_castsi256_si128(out1[i])));
      out[i * outstride + 0] = _mm256_cvtepi16_epi32(
          mm_reverse_epi16(_mm256_extractf128_si256(out1[i], 1)));
    }
  }
}